

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_new_session_ticket(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  uint uVar2;
  uchar *puVar3;
  size_t sVar4;
  mbedtls_ssl_session *pmVar5;
  int iVar6;
  uchar *puVar7;
  size_t sVar8;
  ulong uVar9;
  ulong __size;
  
  iVar6 = mbedtls_ssl_read_record(ssl);
  if (iVar6 == 0) {
    if (ssl->in_msgtype == 0x16) {
      puVar3 = ssl->in_msg;
      if (*puVar3 == '\x04') {
        uVar9 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
        uVar1 = uVar9 + 10;
        if (uVar1 <= ssl->in_hslen) {
          uVar9 = uVar9 | 4;
          __size = (ulong)(ushort)(*(ushort *)(puVar3 + uVar9 + 4) << 8 |
                                  *(ushort *)(puVar3 + uVar9 + 4) >> 8);
          if (uVar1 + __size == ssl->in_hslen) {
            uVar2 = *(uint *)(puVar3 + uVar9);
            ssl->handshake->new_session_ticket = 0;
            ssl->state = 0xc;
            if (__size == 0) {
              return 0;
            }
            puVar7 = ssl->session_negotiate->ticket;
            sVar4 = ssl->session_negotiate->ticket_len;
            if (sVar4 != 0) {
              sVar8 = 0;
              do {
                puVar7[sVar8] = '\0';
                sVar8 = sVar8 + 1;
              } while (sVar4 != sVar8);
              puVar7 = ssl->session_negotiate->ticket;
            }
            free(puVar7);
            pmVar5 = ssl->session_negotiate;
            puVar7 = (uchar *)calloc(1,__size);
            pmVar5->ticket = (uchar *)0x0;
            pmVar5->ticket_len = 0;
            if (puVar7 != (uchar *)0x0) {
              memcpy(puVar7,puVar3 + uVar9 + 6,__size);
              pmVar5->ticket = puVar7;
              pmVar5->ticket_len = __size;
              pmVar5->ticket_lifetime =
                   uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
              pmVar5->id_len = 0;
              return 0;
            }
            mbedtls_ssl_send_alert_message(ssl,'\x02','P');
            return -0x7f00;
          }
        }
      }
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
      iVar6 = -0x6e00;
    }
    else {
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      iVar6 = -0x7700;
    }
  }
  return iVar6;
}

Assistant:

static int ssl_parse_new_session_ticket( mbedtls_ssl_context *ssl )
{
    int ret;
    uint32_t lifetime;
    size_t ticket_len;
    unsigned char *ticket;
    const unsigned char *msg;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse new session ticket" ) );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad new session ticket message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * struct {
     *     uint32 ticket_lifetime_hint;
     *     opaque ticket<0..2^16-1>;
     * } NewSessionTicket;
     *
     * 0  .  3   ticket_lifetime_hint
     * 4  .  5   ticket_len (n)
     * 6  .  5+n ticket content
     */
    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_NEW_SESSION_TICKET ||
        ssl->in_hslen < 6 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad new session ticket message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET );
    }

    msg = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );

    lifetime = ( msg[0] << 24 ) | ( msg[1] << 16 ) |
               ( msg[2] <<  8 ) | ( msg[3]       );

    ticket_len = ( msg[4] << 8 ) | ( msg[5] );

    if( ticket_len + 6 + mbedtls_ssl_hs_hdr_len( ssl ) != ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad new session ticket message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket length: %d", ticket_len ) );

    /* We're not waiting for a NewSessionTicket message any more */
    ssl->handshake->new_session_ticket = 0;
    ssl->state = MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC;

    /*
     * Zero-length ticket means the server changed his mind and doesn't want
     * to send a ticket after all, so just forget it
     */
    if( ticket_len == 0 )
        return( 0 );

    mbedtls_zeroize( ssl->session_negotiate->ticket,
                      ssl->session_negotiate->ticket_len );
    mbedtls_free( ssl->session_negotiate->ticket );
    ssl->session_negotiate->ticket = NULL;
    ssl->session_negotiate->ticket_len = 0;

    if( ( ticket = mbedtls_calloc( 1, ticket_len ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ticket alloc failed" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    memcpy( ticket, msg + 6, ticket_len );

    ssl->session_negotiate->ticket = ticket;
    ssl->session_negotiate->ticket_len = ticket_len;
    ssl->session_negotiate->ticket_lifetime = lifetime;

    /*
     * RFC 5077 section 3.4:
     * "If the client receives a session ticket from the server, then it
     * discards any Session ID that was sent in the ServerHello."
     */
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket in use, discarding session id" ) );
    ssl->session_negotiate->id_len = 0;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse new session ticket" ) );

    return( 0 );
}